

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

bool __thiscall MeCab::anon_unknown_0::LatticeImpl::next(LatticeImpl *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  NBestGenerator *this_00;
  
  iVar3 = (*(this->super_Lattice)._vptr_Lattice[0x12])(this,2);
  pp_Var1 = (this->super_Lattice)._vptr_Lattice;
  if ((char)iVar3 == '\0') {
    (*pp_Var1[0x25])(this,"MECAB_NBEST request type is not set");
  }
  else {
    iVar3 = (*pp_Var1[0x16])(this);
    this_00 = Allocator<mecab_node_t,_mecab_path_t>::nbest_generator
                        ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var,iVar3));
    bVar2 = NBestGenerator::next(this_00);
    if (bVar2) {
      Viterbi::buildResultForNBest(&this->super_Lattice);
      return true;
    }
  }
  return false;
}

Assistant:

bool LatticeImpl::next() {
  if (!has_request_type(MECAB_NBEST)) {
    set_what("MECAB_NBEST request type is not set");
    return false;
  }

  if (!allocator()->nbest_generator()->next()) {
    return false;
  }

  Viterbi::buildResultForNBest(this);
  return true;
}